

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Savepoint(Parse *pParse,int op,Token *pName)

{
  int iVar1;
  Vdbe *p;
  Vdbe *zArg3;
  char *in_RDX;
  int in_ESI;
  Parse *in_RDI;
  Vdbe *v;
  char *zName;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_fffffffffffffff0;
  
  p = (Vdbe *)sqlite3NameFromToken
                        ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (Token *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (p != (Vdbe *)0x0) {
    zArg3 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if ((zArg3 != (Vdbe *)0x0) &&
       (iVar1 = sqlite3AuthCheck(in_RDI,in_ESI,in_RDX,(char *)p,(char *)zArg3), iVar1 == 0)) {
      sqlite3VdbeAddOp4(p,(int)((ulong)zArg3 >> 0x20),(int)zArg3,in_stack_ffffffffffffffd4,
                        in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,0xffffffff),
                        in_stack_fffffffffffffff0);
      return;
    }
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Savepoint(Parse *pParse, int op, Token *pName){
  char *zName = sqlite3NameFromToken(pParse->db, pName);
  if( zName ){
    Vdbe *v = sqlite3GetVdbe(pParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
    static const char * const az[] = { "BEGIN", "RELEASE", "ROLLBACK" };
    assert( !SAVEPOINT_BEGIN && SAVEPOINT_RELEASE==1 && SAVEPOINT_ROLLBACK==2 );
#endif
    if( !v || sqlite3AuthCheck(pParse, SQLITE_SAVEPOINT, az[op], zName, 0) ){
      sqlite3DbFree(pParse->db, zName);
      return;
    }
    sqlite3VdbeAddOp4(v, OP_Savepoint, op, 0, 0, zName, P4_DYNAMIC);
  }
}